

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [64];
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1468;
  int local_143c;
  long local_1438;
  Geometry *local_1430;
  ulong local_1428;
  Scene *local_1420;
  long local_1418;
  long local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  RTCFilterFunctionNArguments local_13d8;
  undefined1 local_13a8 [32];
  undefined1 local_1388 [32];
  undefined1 local_1368 [32];
  undefined1 local_1348 [32];
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  byte local_12c7;
  float local_12b8 [4];
  undefined1 local_12a8 [16];
  float local_1298 [4];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar59 = ray->tfar;
    vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar47 = vucomiss_avx512f(ZEXT416((uint)fVar59));
    auVar67 = ZEXT1664(auVar47);
    if (local_11d8[0] < 9) {
      local_1468 = local_11d8 + 1;
      aVar3 = (ray->dir).field_0.field_1;
      auVar33 = vmaxss_avx512f(auVar47,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar34 = vandps_avx512vl((undefined1  [16])aVar3,auVar34);
      auVar52._8_4_ = 0x219392ef;
      auVar52._0_8_ = 0x219392ef219392ef;
      auVar52._12_4_ = 0x219392ef;
      uVar32 = vcmpps_avx512vl(auVar34,auVar52,1);
      bVar10 = (bool)((byte)uVar32 & 1);
      auVar48._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.x;
      bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.y;
      bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.z;
      bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar48._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * aVar3.field_3.a;
      auVar34 = vrcp14ps_avx512vl(auVar48);
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar35 = vfnmadd213ps_avx512vl(auVar48,auVar34,auVar35);
      vfmadd132ps_fma(auVar35,auVar34,auVar34);
      auVar35 = vucomiss_avx512f(auVar47);
      auVar53 = vbroadcastss_avx512vl(auVar35);
      auVar68 = ZEXT3264(auVar53);
      auVar34 = vmovshdup_avx(auVar35);
      auVar53 = vbroadcastsd_avx512vl(auVar34);
      auVar69 = ZEXT3264(auVar53);
      vshufpd_avx(auVar35,auVar35,1);
      auVar55._8_4_ = 2;
      auVar55._0_8_ = 0x200000002;
      auVar55._12_4_ = 2;
      auVar55._16_4_ = 2;
      auVar55._20_4_ = 2;
      auVar55._24_4_ = 2;
      auVar55._28_4_ = 2;
      fVar63 = auVar35._0_4_ * (ray->org).field_0.m128[0];
      auVar53 = vpermps_avx512vl(auVar55,ZEXT1632(auVar35));
      auVar70 = ZEXT3264(auVar53);
      auVar53._8_4_ = 1;
      auVar53._0_8_ = 0x100000001;
      auVar53._12_4_ = 1;
      auVar53._16_4_ = 1;
      auVar53._20_4_ = 1;
      auVar53._24_4_ = 1;
      auVar53._28_4_ = 1;
      auVar54 = ZEXT1632(CONCAT412(auVar35._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar35._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar35._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar63))));
      auVar53 = vpermps_avx2(auVar53,auVar54);
      auVar55 = vpermps_avx2(auVar55,auVar54);
      lVar27 = 0;
      vucomiss_avx512f(auVar47);
      vucomiss_avx512f(auVar47);
      auVar54 = vbroadcastss_avx512vl(auVar33);
      auVar71 = ZEXT3264(auVar54);
      local_11f8._4_4_ = fVar59;
      local_11f8._0_4_ = fVar59;
      local_11f8._8_4_ = fVar59;
      local_11f8._12_4_ = fVar59;
      local_11f8._16_4_ = fVar59;
      local_11f8._20_4_ = fVar59;
      local_11f8._24_4_ = fVar59;
      local_11f8._28_4_ = fVar59;
      auVar64 = ZEXT3264(local_11f8);
      local_1218._0_8_ = CONCAT44(fVar63,fVar63) ^ 0x8000000080000000;
      local_1218._8_4_ = -fVar63;
      local_1218._12_4_ = -fVar63;
      local_1218._16_4_ = -fVar63;
      local_1218._20_4_ = -fVar63;
      local_1218._24_4_ = -fVar63;
      local_1218._28_4_ = -fVar63;
      auVar66 = ZEXT3264(local_1218);
      local_1238._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
      local_1238._8_4_ = auVar53._8_4_ ^ 0x80000000;
      local_1238._12_4_ = auVar53._12_4_ ^ 0x80000000;
      local_1238._16_4_ = auVar53._16_4_ ^ 0x80000000;
      local_1238._20_4_ = auVar53._20_4_ ^ 0x80000000;
      local_1238._24_4_ = auVar53._24_4_ ^ 0x80000000;
      local_1238._28_4_ = auVar53._28_4_ ^ 0x80000000;
      auVar65 = ZEXT3264(local_1238);
      local_1258._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      local_1258._8_4_ = auVar55._8_4_ ^ 0x80000000;
      local_1258._12_4_ = auVar55._12_4_ ^ 0x80000000;
      local_1258._16_4_ = auVar55._16_4_ ^ 0x80000000;
      local_1258._20_4_ = auVar55._20_4_ ^ 0x80000000;
      local_1258._24_4_ = auVar55._24_4_ ^ 0x80000000;
      local_1258._28_4_ = auVar55._28_4_ ^ 0x80000000;
      auVar62 = ZEXT3264(local_1258);
      local_1418 = 0;
LAB_01c62605:
      if (local_1468 != local_11d8) {
        uVar32 = local_1468[-1];
        local_1468 = local_1468 + -1;
        do {
          uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar54._4_4_ = uVar2;
          auVar54._0_4_ = uVar2;
          auVar54._8_4_ = uVar2;
          auVar54._12_4_ = uVar2;
          auVar54._16_4_ = uVar2;
          auVar54._20_4_ = uVar2;
          auVar54._24_4_ = uVar2;
          auVar54._28_4_ = uVar2;
          do {
            if ((uVar32 & 8) != 0) {
              local_1410 = (ulong)((uint)uVar32 & 0xf) - 8;
              uVar32 = uVar32 & 0xfffffffffffffff0;
              local_1438 = 0;
              goto LAB_01c627a0;
            }
            uVar17 = uVar32 & 0xfffffffffffffff0;
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar27),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar27));
            auVar53 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar68._0_32_,auVar66._0_32_);
            auVar55 = vmaxps_avx512vl(auVar71._0_32_,auVar53);
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x140),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0x80));
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x180),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0xc0));
            auVar53 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar69._0_32_,auVar65._0_32_);
            auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar34),auVar70._0_32_,auVar62._0_32_);
            auVar53 = vmaxps_avx(auVar53,auVar56);
            auVar53 = vmaxps_avx(auVar55,auVar53);
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x120),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0x60));
            auVar55 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar68._0_32_,auVar66._0_32_);
            auVar55 = vminps_avx(auVar64._0_32_,auVar55);
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x160),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0xa0));
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x1a0),auVar54,
                                      *(undefined1 (*) [32])(uVar17 + 0xe0));
            auVar56 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar69._0_32_,auVar65._0_32_);
            auVar57 = vfmadd213ps_avx512vl(ZEXT1632(auVar34),auVar70._0_32_,auVar62._0_32_);
            auVar56 = vminps_avx(auVar56,auVar57);
            auVar55 = vminps_avx(auVar55,auVar56);
            if (((uint)uVar32 & 7) == 6) {
              uVar14 = vcmpps_avx512vl(auVar53,auVar55,2);
              uVar15 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [32])(uVar17 + 0x1c0),0xd);
              uVar16 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
              uVar18 = (uint)uVar14 & (uint)uVar15 & (uint)uVar16;
            }
            else {
              uVar14 = vcmpps_avx512vl(auVar53,auVar55,2);
              uVar18 = (uint)uVar14;
            }
            if ((byte)uVar18 == 0) goto LAB_01c62605;
            lVar21 = 0;
            for (uVar32 = (ulong)(byte)uVar18; (uVar32 & 1) == 0;
                uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar32 = *(ulong *)(uVar17 + lVar21 * 8);
            uVar18 = (uVar18 & 0xff) - 1 & uVar18 & 0xff;
            uVar19 = (ulong)uVar18;
          } while (uVar18 == 0);
          do {
            *local_1468 = uVar32;
            local_1468 = local_1468 + 1;
            lVar21 = 0;
            for (uVar32 = uVar19; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar19 = uVar19 - 1 & uVar19;
            uVar32 = *(ulong *)(uVar17 + lVar21 * 8);
          } while (uVar19 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_01c627a0:
  if (local_1438 == local_1410) goto LAB_01c62605;
  lVar20 = local_1438 * 0x50;
  local_1420 = context->scene;
  pGVar8 = (context->scene->geometries).items[*(uint *)(uVar32 + 0x30 + lVar20)].ptr;
  fVar59 = (pGVar8->time_range).lower;
  fVar59 = pGVar8->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar59) / ((pGVar8->time_range).upper - fVar59));
  auVar47 = vroundss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),9);
  auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar36 = vmaxss_avx512f(auVar67._0_16_,auVar47);
  lVar21 = (long)(int)auVar36._0_4_ * 0x38;
  lVar27 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar21);
  auVar47 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar32 + lVar20) * 4);
  uVar19 = CONCAT44(0,*(uint *)(uVar32 + 0x10 + lVar20));
  local_1348._0_8_ = uVar19;
  auVar34 = *(undefined1 (*) [16])(lVar27 + uVar19 * 4);
  uVar22 = CONCAT44(0,*(uint *)(uVar32 + 0x20 + lVar20));
  local_1368._0_8_ = uVar22;
  auVar35 = *(undefined1 (*) [16])(lVar27 + uVar22 * 4);
  uVar23 = CONCAT44(0,*(uint *)(uVar32 + 4 + lVar20));
  local_1388._0_8_ = uVar23;
  auVar33 = *(undefined1 (*) [16])(lVar27 + uVar23 * 4);
  uVar24 = CONCAT44(0,*(uint *)(uVar32 + 0x14 + lVar20));
  local_13a8._0_8_ = uVar24;
  auVar48 = *(undefined1 (*) [16])(lVar27 + uVar24 * 4);
  uVar25 = (ulong)*(uint *)(uVar32 + 0x24 + lVar20);
  auVar52 = *(undefined1 (*) [16])(lVar27 + uVar25 * 4);
  uVar30 = (ulong)*(uint *)(uVar32 + 8 + lVar20);
  auVar37 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
  uVar31 = (ulong)*(uint *)(uVar32 + 0x18 + lVar20);
  auVar39 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
  uVar29 = (ulong)*(uint *)(uVar32 + 0x28 + lVar20);
  auVar50 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
  uVar17 = (ulong)*(uint *)(uVar32 + 0xc + lVar20);
  auVar51 = *(undefined1 (*) [16])(lVar27 + uVar17 * 4);
  uVar26 = (ulong)*(uint *)(uVar32 + 0x1c + lVar20);
  auVar49 = *(undefined1 (*) [16])(lVar27 + uVar26 * 4);
  lVar21 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar21);
  uVar28 = (ulong)*(uint *)(uVar32 + 0x2c + lVar20);
  auVar38 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
  auVar40 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar32 + lVar20) * 4);
  auVar41 = *(undefined1 (*) [16])(lVar21 + uVar19 * 4);
  auVar44 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
  auVar42 = *(undefined1 (*) [16])(lVar21 + uVar23 * 4);
  auVar43 = *(undefined1 (*) [16])(lVar21 + uVar24 * 4);
  auVar45 = *(undefined1 (*) [16])(lVar21 + uVar25 * 4);
  auVar46 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
  auVar58 = *(undefined1 (*) [16])(lVar21 + uVar31 * 4);
  auVar4 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
  auVar5 = *(undefined1 (*) [16])(lVar21 + uVar17 * 4);
  auVar6 = *(undefined1 (*) [16])(lVar21 + uVar26 * 4);
  auVar7 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
  puVar1 = (undefined8 *)(uVar32 + 0x30 + lVar20);
  local_1318 = *puVar1;
  uStack_1310 = puVar1[1];
  puVar1 = (undefined8 *)(uVar32 + 0x40 + lVar20);
  auVar11 = vunpcklps_avx(auVar47,auVar37);
  auVar47 = vunpckhps_avx(auVar47,auVar37);
  auVar37 = vunpcklps_avx(auVar33,auVar51);
  auVar33 = vunpckhps_avx(auVar33,auVar51);
  auVar51 = vunpcklps_avx(auVar47,auVar33);
  auVar12 = vunpcklps_avx(auVar11,auVar37);
  auVar47 = vunpckhps_avx(auVar11,auVar37);
  auVar37 = vunpcklps_avx(auVar34,auVar39);
  auVar34 = vunpckhps_avx(auVar34,auVar39);
  auVar39 = vunpcklps_avx(auVar48,auVar49);
  auVar33 = vunpckhps_avx(auVar48,auVar49);
  auVar48 = vunpcklps_avx(auVar34,auVar33);
  auVar49 = vunpcklps_avx(auVar37,auVar39);
  auVar34 = vunpckhps_avx(auVar37,auVar39);
  auVar37 = vunpcklps_avx(auVar35,auVar50);
  auVar35 = vunpckhps_avx(auVar35,auVar50);
  auVar39 = vunpcklps_avx(auVar52,auVar38);
  auVar33 = vunpckhps_avx(auVar52,auVar38);
  auVar52 = vunpcklps_avx(auVar35,auVar33);
  auVar50 = vunpcklps_avx(auVar37,auVar39);
  auVar35 = vunpckhps_avx(auVar37,auVar39);
  auVar33 = vunpcklps_avx512vl(auVar40,auVar46);
  auVar37 = vunpckhps_avx512vl(auVar40,auVar46);
  auVar38 = vunpcklps_avx512vl(auVar42,auVar5);
  auVar39 = vunpckhps_avx512vl(auVar42,auVar5);
  auVar37 = vunpcklps_avx(auVar37,auVar39);
  auVar39 = vunpcklps_avx(auVar33,auVar38);
  auVar33 = vunpckhps_avx(auVar33,auVar38);
  auVar38 = vunpcklps_avx512vl(auVar41,auVar58);
  auVar40 = vunpckhps_avx512vl(auVar41,auVar58);
  auVar41 = vunpcklps_avx512vl(auVar43,auVar6);
  auVar42 = vunpckhps_avx512vl(auVar43,auVar6);
  auVar40 = vunpcklps_avx512vl(auVar40,auVar42);
  auVar42 = vunpcklps_avx512vl(auVar38,auVar41);
  auVar41 = vunpckhps_avx512vl(auVar38,auVar41);
  auVar43 = vunpcklps_avx512vl(auVar44,auVar4);
  auVar38 = vunpckhps_avx512vl(auVar44,auVar4);
  auVar44 = vunpcklps_avx512vl(auVar45,auVar7);
  auVar45 = vunpckhps_avx512vl(auVar45,auVar7);
  auVar38 = vunpcklps_avx(auVar38,auVar45);
  auVar45 = vunpcklps_avx512vl(auVar43,auVar44);
  auVar44 = vunpckhps_avx512vl(auVar43,auVar44);
  auVar46 = ZEXT416((uint)(fVar59 - auVar36._0_4_));
  auVar43 = vbroadcastss_avx512vl(auVar46);
  auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
  auVar58._0_4_ = auVar46._0_4_;
  auVar58._4_4_ = auVar58._0_4_;
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._0_4_;
  auVar39 = vmulps_avx512vl(auVar43,auVar39);
  auVar33 = vmulps_avx512vl(auVar43,auVar33);
  auVar46 = vmulps_avx512vl(auVar43,auVar37);
  auVar37 = vfmadd231ps_fma(auVar39,auVar58,auVar12);
  auVar39 = vfmadd231ps_fma(auVar33,auVar58,auVar47);
  auVar51 = vfmadd231ps_fma(auVar46,auVar58,auVar51);
  auVar47 = vmulps_avx512vl(auVar43,auVar42);
  auVar33 = vmulps_avx512vl(auVar43,auVar41);
  auVar40 = vmulps_avx512vl(auVar43,auVar40);
  auVar47 = vfmadd231ps_fma(auVar47,auVar58,auVar49);
  auVar34 = vfmadd231ps_fma(auVar33,auVar58,auVar34);
  auVar33 = vfmadd231ps_fma(auVar40,auVar58,auVar48);
  auVar48 = vmulps_avx512vl(auVar43,auVar45);
  auVar49 = vmulps_avx512vl(auVar43,auVar44);
  auVar38 = vmulps_avx512vl(auVar43,auVar38);
  auVar48 = vfmadd231ps_fma(auVar48,auVar58,auVar50);
  auVar50 = vfmadd231ps_fma(auVar49,auVar58,auVar35);
  auVar52 = vfmadd231ps_fma(auVar38,auVar58,auVar52);
  local_1328 = *puVar1;
  uStack_1320 = puVar1[1];
  auVar47 = vsubps_avx(auVar37,auVar47);
  auVar34 = vsubps_avx(auVar39,auVar34);
  auVar35 = vsubps_avx(auVar51,auVar33);
  auVar33 = vsubps_avx(auVar48,auVar37);
  auVar48 = vsubps_avx(auVar50,auVar39);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar49._0_4_ = auVar34._0_4_ * auVar52._0_4_;
  auVar49._4_4_ = auVar34._4_4_ * auVar52._4_4_;
  auVar49._8_4_ = auVar34._8_4_ * auVar52._8_4_;
  auVar49._12_4_ = auVar34._12_4_ * auVar52._12_4_;
  local_1288 = vfmsub231ps_fma(auVar49,auVar48,auVar35);
  auVar38._0_4_ = auVar35._0_4_ * auVar33._0_4_;
  auVar38._4_4_ = auVar35._4_4_ * auVar33._4_4_;
  auVar38._8_4_ = auVar35._8_4_ * auVar33._8_4_;
  auVar38._12_4_ = auVar35._12_4_ * auVar33._12_4_;
  local_1278 = vfmsub231ps_fma(auVar38,auVar52,auVar47);
  auVar40._0_4_ = auVar47._0_4_ * auVar48._0_4_;
  auVar40._4_4_ = auVar47._4_4_ * auVar48._4_4_;
  auVar40._8_4_ = auVar47._8_4_ * auVar48._8_4_;
  auVar40._12_4_ = auVar47._12_4_ * auVar48._12_4_;
  fVar59 = (ray->dir).field_0.m128[0];
  auVar42._4_4_ = fVar59;
  auVar42._0_4_ = fVar59;
  auVar42._8_4_ = fVar59;
  auVar42._12_4_ = fVar59;
  auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  uVar2 = *(undefined4 *)&(ray->org).field_0;
  auVar50._4_4_ = uVar2;
  auVar50._0_4_ = uVar2;
  auVar50._8_4_ = uVar2;
  auVar50._12_4_ = uVar2;
  auVar50 = vsubps_avx512vl(auVar37,auVar50);
  local_1268 = vfmsub231ps_fma(auVar40,auVar33,auVar34);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar37._4_4_ = uVar2;
  auVar37._0_4_ = uVar2;
  auVar37._8_4_ = uVar2;
  auVar37._12_4_ = uVar2;
  auVar40 = vsubps_avx512vl(auVar39,auVar37);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  auVar39 = vsubps_avx512vl(auVar51,auVar39);
  auVar37 = vmulps_avx512vl(auVar49,auVar39);
  auVar41 = vfmsub231ps_avx512vl(auVar37,auVar40,auVar38);
  auVar37 = vmulps_avx512vl(auVar38,auVar50);
  auVar37 = vfmsub231ps_fma(auVar37,auVar39,auVar42);
  auVar44._0_4_ = fVar59 * auVar40._0_4_;
  auVar44._4_4_ = fVar59 * auVar40._4_4_;
  auVar44._8_4_ = fVar59 * auVar40._8_4_;
  auVar44._12_4_ = fVar59 * auVar40._12_4_;
  auVar44 = vfmsub231ps_avx512vl(auVar44,auVar50,auVar49);
  auVar51 = vmulps_avx512vl(local_1268,auVar38);
  auVar51 = vfmadd231ps_avx512vl(auVar51,local_1278,auVar49);
  auVar49 = vfmadd231ps_avx512vl(auVar51,local_1288,auVar42);
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  local_12d8 = vandps_avx512vl(auVar49,auVar51);
  auVar52 = vmulps_avx512vl(auVar52,auVar44);
  auVar48 = vfmadd231ps_avx512vl(auVar52,auVar37,auVar48);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar41,auVar33);
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  auVar33 = vandpd_avx512vl(auVar49,auVar33);
  local_1308 = vxorps_avx512vl(auVar33,auVar48);
  auVar43._0_4_ = auVar35._0_4_ * auVar44._0_4_;
  auVar43._4_4_ = auVar35._4_4_ * auVar44._4_4_;
  auVar43._8_4_ = auVar35._8_4_ * auVar44._8_4_;
  auVar43._12_4_ = auVar35._12_4_ * auVar44._12_4_;
  auVar34 = vfmadd231ps_fma(auVar43,auVar34,auVar37);
  auVar47 = vfmadd231ps_fma(auVar34,auVar47,auVar41);
  local_12f8._0_4_ = (float)(auVar33._0_4_ ^ auVar47._0_4_);
  local_12f8._4_4_ = (float)(auVar33._4_4_ ^ auVar47._4_4_);
  local_12f8._8_4_ = (float)(auVar33._8_4_ ^ auVar47._8_4_);
  local_12f8._12_4_ = (float)(auVar33._12_4_ ^ auVar47._12_4_);
  auVar47 = ZEXT816(0) << 0x20;
  uVar14 = vcmpps_avx512vl(local_1308,auVar47,5);
  uVar15 = vcmpps_avx512vl(local_12f8,auVar47,5);
  uVar16 = vcmpps_avx512vl(auVar49,auVar47,4);
  auVar47._0_4_ = local_1308._0_4_ + local_12f8._0_4_;
  auVar47._4_4_ = local_1308._4_4_ + local_12f8._4_4_;
  auVar47._8_4_ = local_1308._8_4_ + local_12f8._8_4_;
  auVar47._12_4_ = local_1308._12_4_ + local_12f8._12_4_;
  uVar13 = vcmpps_avx512vl(auVar47,local_12d8,2);
  local_12c7 = (byte)uVar14 & (byte)uVar15 & (byte)uVar16 & (byte)uVar13;
  if (local_12c7 != 0) {
    auVar46._0_4_ = auVar39._0_4_ * local_1268._0_4_;
    auVar46._4_4_ = auVar39._4_4_ * local_1268._4_4_;
    auVar46._8_4_ = auVar39._8_4_ * local_1268._8_4_;
    auVar46._12_4_ = auVar39._12_4_ * local_1268._12_4_;
    auVar47 = vfmadd213ps_fma(auVar40,local_1278,auVar46);
    auVar47 = vfmadd213ps_fma(auVar50,local_1288,auVar47);
    local_12e8._0_4_ = (float)(auVar33._0_4_ ^ auVar47._0_4_);
    local_12e8._4_4_ = (float)(auVar33._4_4_ ^ auVar47._4_4_);
    local_12e8._8_4_ = (float)(auVar33._8_4_ ^ auVar47._8_4_);
    local_12e8._12_4_ = (float)(auVar33._12_4_ ^ auVar47._12_4_);
    uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar41._4_4_ = uVar2;
    auVar41._0_4_ = uVar2;
    auVar41._8_4_ = uVar2;
    auVar41._12_4_ = uVar2;
    auVar47 = vmulps_avx512vl(local_12d8,auVar41);
    fVar59 = ray->tfar;
    auVar45._4_4_ = fVar59;
    auVar45._0_4_ = fVar59;
    auVar45._8_4_ = fVar59;
    auVar45._12_4_ = fVar59;
    auVar34 = vmulps_avx512vl(local_12d8,auVar45);
    uVar14 = vcmpps_avx512vl(local_12e8,auVar34,2);
    uVar15 = vcmpps_avx512vl(auVar47,local_12e8,1);
    local_12c7 = (byte)uVar14 & (byte)uVar15 & local_12c7;
    if (local_12c7 != 0) {
      auVar47 = vrcp14ps_avx512vl(local_12d8);
      auVar4._8_4_ = 0x3f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar4._12_4_ = 0x3f800000;
      auVar34 = vfnmadd213ps_avx512vl(local_12d8,auVar47,auVar4);
      auVar47 = vfmadd132ps_fma(auVar34,auVar47,auVar47);
      fVar59 = auVar47._0_4_;
      fVar63 = auVar47._4_4_;
      fVar60 = auVar47._8_4_;
      fVar61 = auVar47._12_4_;
      local_1298[0] = fVar59 * local_12e8._0_4_;
      local_1298[1] = fVar63 * local_12e8._4_4_;
      local_1298[2] = fVar60 * local_12e8._8_4_;
      local_1298[3] = fVar61 * local_12e8._12_4_;
      local_12b8[0] = fVar59 * local_1308._0_4_;
      local_12b8[1] = fVar63 * local_1308._4_4_;
      local_12b8[2] = fVar60 * local_1308._8_4_;
      local_12b8[3] = fVar61 * local_1308._12_4_;
      local_12a8._0_4_ = fVar59 * local_12f8._0_4_;
      local_12a8._4_4_ = fVar63 * local_12f8._4_4_;
      local_12a8._8_4_ = fVar60 * local_12f8._8_4_;
      local_12a8._12_4_ = fVar61 * local_12f8._12_4_;
      uVar17 = (ulong)local_12c7;
      do {
        auVar47 = auVar67._0_16_;
        local_1428 = 0;
        for (uVar19 = uVar17; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          local_1428 = local_1428 + 1;
        }
        local_13f0 = *(uint *)((long)&local_1318 + local_1428 * 4);
        local_1430 = (local_1420->geometries).items[local_13f0].ptr;
        if ((local_1430->mask & ray->mask) != 0) {
          pRVar9 = context->args;
          if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
             (local_1430->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c62eea:
            ray->tfar = -INFINITY;
            return;
          }
          local_13a8 = auVar71._0_32_;
          local_1388 = auVar70._0_32_;
          local_1368 = auVar69._0_32_;
          local_1348 = auVar68._0_32_;
          uVar19 = (ulong)(uint)((int)local_1428 * 4);
          local_13d8.context = context->user;
          local_1408 = *(undefined4 *)(local_1288 + uVar19);
          local_1404 = *(undefined4 *)(local_1278 + uVar19);
          local_1400 = *(undefined4 *)(local_1268 + uVar19);
          local_13fc = *(undefined4 *)((long)local_12b8 + uVar19);
          local_13f8 = *(undefined4 *)(local_12a8 + uVar19);
          local_13f4 = *(undefined4 *)((long)&local_1328 + uVar19);
          local_13ec = (local_13d8.context)->instID[0];
          local_13e8 = (local_13d8.context)->instPrimID[0];
          fVar59 = ray->tfar;
          ray->tfar = *(float *)((long)local_1298 + uVar19);
          local_143c = -1;
          local_13d8.valid = &local_143c;
          local_13d8.geometryUserPtr = local_1430->userPtr;
          local_13d8.hit = (RTCHitN *)&local_1408;
          local_13d8.N = 1;
          local_13d8.ray = (RTCRayN *)ray;
          if (((local_1430->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
              ((*local_1430->occlusionFilterN)(&local_13d8), *local_13d8.valid != 0)) &&
             ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
              ((((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_1430->field_8).field_0x2 & 0x40) == 0))
               || ((*pRVar9->filter)(&local_13d8), *local_13d8.valid != 0)))))) goto LAB_01c62eea;
          ray->tfar = fVar59;
          auVar47 = vxorps_avx512vl(auVar47,auVar47);
          auVar67 = ZEXT1664(auVar47);
          auVar68 = ZEXT3264(local_1348);
          auVar69 = ZEXT3264(local_1368);
          auVar70 = ZEXT3264(local_1388);
          auVar71 = ZEXT3264(local_13a8);
        }
        uVar17 = uVar17 ^ 1L << (local_1428 & 0x3f);
      } while (uVar17 != 0);
    }
  }
  local_1438 = local_1438 + 1;
  auVar64 = ZEXT3264(local_11f8);
  auVar66 = ZEXT3264(local_1218);
  auVar65 = ZEXT3264(local_1238);
  auVar62 = ZEXT3264(local_1258);
  lVar27 = local_1418;
  goto LAB_01c627a0;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }